

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bool __thiscall slang::ast::Type::isValidForDPIReturn(Type *this)

{
  SymbolKind SVar1;
  
  if (this->canonical == (Type *)0x0) {
    resolveCanonical(this);
  }
  SVar1 = (this->canonical->super_Symbol).kind;
  return (bool)((byte)(0x34001c0 >> ((byte)SVar1 & 0x1f)) & SVar1 < EventType);
}

Assistant:

bool Type::isValidForDPIReturn() const {
    switch (getCanonicalType().kind) {
        case SymbolKind::VoidType:
        case SymbolKind::FloatingType:
        case SymbolKind::CHandleType:
        case SymbolKind::StringType:
        case SymbolKind::ScalarType:
        case SymbolKind::PredefinedIntegerType:
            return true;
        default:
            return false;
    }
}